

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

StkId tryfuncTM(lua_State *L,StkId func)

{
  long lVar1;
  TValue *pTVar2;
  TValue *io2_1;
  TValue *io1_1;
  TValue *io2;
  TValue *io1;
  ptrdiff_t t__;
  StkId p;
  TValue *tm;
  StkId func_local;
  lua_State *L_local;
  
  tm = (TValue *)func;
  if ((long)(L->stack_last).p - (L->top).offset >> 4 < 2) {
    lVar1 = (L->stack).offset;
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    luaD_growstack(L,1,1);
    tm = (TValue *)((long)(L->stack).p + ((long)func - lVar1));
  }
  pTVar2 = luaT_gettmbyobj(L,tm,TM_CALL);
  if ((pTVar2->tt_ & 0xf) != 0) {
    for (t__ = (L->top).offset; tm < (ulong)t__; t__ = t__ + -0x10) {
      *(undefined8 *)t__ = *(undefined8 *)(t__ + -0x10);
      *(undefined1 *)(t__ + 8) = *(undefined1 *)(t__ + -8);
    }
    (L->top).p = (StkId)((L->top).offset + 0x10);
    tm->value_ = pTVar2->value_;
    tm->tt_ = pTVar2->tt_;
    return (StkId)tm;
  }
  luaG_callerror(L,tm);
}

Assistant:

static StkId tryfuncTM (lua_State *L, StkId func) {
  const TValue *tm;
  StkId p;
  checkstackGCp(L, 1, func);  /* space for metamethod */
  tm = luaT_gettmbyobj(L, s2v(func), TM_CALL);  /* (after previous GC) */
  if (l_unlikely(ttisnil(tm)))
    luaG_callerror(L, s2v(func));  /* nothing to call */
  for (p = L->top.p; p > func; p--)  /* open space for metamethod */
    setobjs2s(L, p, p-1);
  L->top.p++;  /* stack space pre-allocated by the caller */
  setobj2s(L, func, tm);  /* metamethod is the new function to be called */
  return func;
}